

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_log__do_push_element_bool(char *prefix,size_t prefix_len,int v)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long *in_FS_OFFSET;
  int v_local;
  size_t prefix_len_local;
  char *prefix_local;
  
  iVar3 = expand_logbuf_or_invalidate(prefix,prefix_len,5);
  if (iVar3 != 0) {
    if (v == 0) {
      lVar1 = *(long *)(*in_FS_OFFSET + -0x140);
      lVar2 = *(long *)(*in_FS_OFFSET + -0x130);
      *(undefined4 *)(lVar1 + lVar2) = 0x736c6166;
      *(undefined1 *)(lVar1 + 4 + lVar2) = 0x65;
      *(long *)(*in_FS_OFFSET + -0x130) = *(long *)(*in_FS_OFFSET + -0x130) + 5;
    }
    else {
      *(undefined4 *)(*(long *)(*in_FS_OFFSET + -0x140) + *(long *)(*in_FS_OFFSET + -0x130)) =
           0x65757274;
      *(long *)(*in_FS_OFFSET + -0x130) = *(long *)(*in_FS_OFFSET + -0x130) + 4;
    }
  }
  return;
}

Assistant:

void ptls_log__do_push_element_bool(const char *prefix, size_t prefix_len, int v)
{
    if (expand_logbuf_or_invalidate(prefix, prefix_len, 5)) {
        if (v) {
            memcpy(logbuf.buf.base + logbuf.buf.off, "true", 4);
            logbuf.buf.off += 4;
        } else {
            memcpy(logbuf.buf.base + logbuf.buf.off, "false", 5);
            logbuf.buf.off += 5;
        }
    }
}